

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::push_label(S2Builder *this,Label label)

{
  ostream *poVar1;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  Label local_14;
  S2Builder *pSStack_10;
  Label label_local;
  S2Builder *this_local;
  
  local_14 = label;
  pSStack_10 = this;
  if (-1 < label) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->label_set_,&local_14);
    this->label_set_modified_ = true;
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x126,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_28);
  poVar1 = std::operator<<(poVar1,"Check failed: (label) >= (0) ");
  S2LogMessageVoidify::operator&(&local_15,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

void S2Builder::push_label(Label label) {
  S2_DCHECK_GE(label, 0);
  label_set_.push_back(label);
  label_set_modified_ = true;
}